

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int EXRLayers(char *filename,char ***layer_names,int *num_layers,char **err)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  pointer pbVar4;
  size_t c;
  ulong uVar5;
  long lVar6;
  pointer pbVar7;
  allocator<char> local_f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_vec;
  EXRVersion exr_version;
  EXRHeader exr_header;
  
  memset(&exr_header,0,0x88);
  iVar1 = ParseEXRVersionFromFile(&exr_version,filename);
  if (iVar1 == 0) {
    if (exr_version.non_image == 0 && exr_version.multipart == 0) {
      iVar1 = ParseEXRHeaderFromFile(&exr_header,&exr_version,filename,err);
      if (iVar1 == 0) {
        layer_vec.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        layer_vec.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        layer_vec.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tinyexr::GetLayers(&exr_header,&layer_vec);
        pbVar4 = layer_vec.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar7 = layer_vec.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *num_layers = (int)((ulong)((long)layer_vec.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)layer_vec.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5);
        ppcVar2 = (char **)malloc((long)layer_vec.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)layer_vec.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2);
        *layer_names = ppcVar2;
        lVar6 = 0;
        for (uVar5 = 0; uVar5 < (ulong)((long)pbVar4 - (long)pbVar7 >> 5); uVar5 = uVar5 + 1) {
          pcVar3 = strdup(*(char **)((long)&(pbVar7->_M_dataplus)._M_p + lVar6));
          (*layer_names)[uVar5] = pcVar3;
          lVar6 = lVar6 + 0x20;
          pbVar4 = layer_vec.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar7 = layer_vec.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        FreeEXRHeader(&exr_header);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&layer_vec);
        iVar1 = 0;
      }
      else {
        FreeEXRHeader(&exr_header);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&layer_vec,
                 "Loading multipart or DeepImage is not supported  in LoadEXR() API",&local_f9);
      tinyexr::SetErrorMessage((string *)&layer_vec,err);
      std::__cxx11::string::~string((string *)&layer_vec);
      iVar1 = -4;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&layer_vec,"Invalid EXR header.",&local_f9);
    tinyexr::SetErrorMessage((string *)&layer_vec,err);
    std::__cxx11::string::~string((string *)&layer_vec);
  }
  return iVar1;
}

Assistant:

int EXRLayers(const char *filename, const char **layer_names[], int *num_layers, const char **err) {
  EXRVersion exr_version;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      tinyexr::SetErrorMessage("Invalid EXR header.", err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
        "Loading multipart or DeepImage is not supported  in LoadEXR() API",
        err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
  if (ret != TINYEXR_SUCCESS) {
    FreeEXRHeader(&exr_header);
    return ret;
  }

  std::vector<std::string> layer_vec;
  tinyexr::GetLayers(exr_header, layer_vec);

  (*num_layers) = int(layer_vec.size());
  (*layer_names) = static_cast<const char **>(
    malloc(sizeof(const char *) * static_cast<size_t>(layer_vec.size())));
  for (size_t c = 0; c < static_cast<size_t>(layer_vec.size()); c++) {
#ifdef _MSC_VER
    (*layer_names)[c] = _strdup(layer_vec[c].c_str());
#else
    (*layer_names)[c] = strdup(layer_vec[c].c_str());
#endif
  }

  FreeEXRHeader(&exr_header);
  return TINYEXR_SUCCESS;
}